

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocatorTest.cpp
# Opt level: O3

void __thiscall
TEST_GlobalMemoryAccountant_stop_Test::~TEST_GlobalMemoryAccountant_stop_Test
          (TEST_GlobalMemoryAccountant_stop_Test *this)

{
  (this->super_TEST_GROUP_CppUTestGroupGlobalMemoryAccountant).super_Utest._vptr_Utest =
       (_func_int **)&PTR__TEST_GROUP_CppUTestGroupGlobalMemoryAccountant_00389eb8;
  ExecFunctionWithoutParameters::~ExecFunctionWithoutParameters
            ((ExecFunctionWithoutParameters *)
             &(this->super_TEST_GROUP_CppUTestGroupGlobalMemoryAccountant).testFunction);
  TestTestingFixture::~TestTestingFixture
            (&(this->super_TEST_GROUP_CppUTestGroupGlobalMemoryAccountant).fixture);
  GlobalMemoryAccountant::~GlobalMemoryAccountant
            (&(this->super_TEST_GROUP_CppUTestGroupGlobalMemoryAccountant).accountant);
  Utest::~Utest((Utest *)this);
  operator_delete(this,0x98);
  return;
}

Assistant:

TEST(GlobalMemoryAccountant, stop)
{
    TestMemoryAllocator* originalMallocAllocator = getCurrentMallocAllocator();
    TestMemoryAllocator* originalNewAllocator = getCurrentNewAllocator();
    TestMemoryAllocator* originalNewArrayAllocator = getCurrentNewArrayAllocator();

    accountant.start();
    accountant.stop();

    POINTERS_EQUAL(originalMallocAllocator, getCurrentMallocAllocator());
    POINTERS_EQUAL(originalNewAllocator, getCurrentNewAllocator());
    POINTERS_EQUAL(originalNewArrayAllocator, getCurrentNewArrayAllocator());
}